

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QTableView::setSortingEnabled(QTableView *this,bool enable)

{
  long lVar1;
  Connection *pCVar2;
  void **ppvVar3;
  void **ppvVar4;
  int column;
  SortOrder order;
  undefined4 *puVar5;
  QTableViewPrivate *d;
  Connection *connection;
  Connection *pCVar6;
  Connection *this_00;
  long lVar7;
  long in_FS_OFFSET;
  code *local_68;
  undefined8 local_60;
  QSlotObjectBase local_58;
  undefined1 local_48 [8];
  ImplFn local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                    super_QWidget.field_0x8;
  QHeaderView::setSortIndicatorShown(*(QHeaderView **)(lVar1 + 0x580),enable);
  pCVar2 = *(Connection **)(lVar1 + 0x630);
  for (pCVar6 = *(Connection **)(lVar1 + 0x628); pCVar6 != pCVar2; pCVar6 = pCVar6 + 1) {
    QObject::disconnect(pCVar6);
  }
  pCVar6 = *(Connection **)(lVar1 + 0x628);
  pCVar2 = *(Connection **)(lVar1 + 0x630);
  this_00 = pCVar6;
  if (pCVar2 != pCVar6) {
    do {
      QMetaObject::Connection::~Connection(this_00);
      this_00 = this_00 + 1;
    } while (this_00 != pCVar2);
    *(Connection **)(lVar1 + 0x630) = pCVar6;
  }
  if (enable) {
    column = QHeaderView::sortIndicatorSection(*(QHeaderView **)(lVar1 + 0x580));
    order = QHeaderView::sortIndicatorOrder(*(QHeaderView **)(lVar1 + 0x580));
    sortByColumn(this,column,order);
    ppvVar3 = *(void ***)(lVar1 + 0x580);
    local_68 = QHeaderView::sortIndicatorChanged;
    local_60 = 0;
    local_48 = (undefined1  [8])QTableViewPrivate::sortIndicatorChanged;
    local_40 = (ImplFn)0x0;
    ppvVar4 = *(void ***)(lVar1 + 8);
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QPrivateSlotObject<void_(QTableViewPrivate::*)(int,_Qt::SortOrder),_QtPrivate::List<int,_Qt::SortOrder>,_void>
         ::impl;
    *(code **)(puVar5 + 4) = QTableViewPrivate::sortIndicatorChanged;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              ((QObject *)&local_58,ppvVar3,(QObject *)&local_68,ppvVar4,(QSlotObjectBase *)local_48
               ,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>::
    _M_assign_aux<QMetaObject::Connection_const*>
              ((vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>> *)
               (lVar1 + 0x628),(QObject *)&local_58,&local_58.m_impl);
    QMetaObject::Connection::~Connection((Connection *)&local_58);
  }
  else {
    ppvVar3 = *(void ***)(lVar1 + 0x580);
    local_58._0_8_ = selectColumn;
    local_58.m_impl = (ImplFn)0x0;
    local_68 = QHeaderView::sectionPressed;
    local_60 = 0;
    puVar5 = (undefined4 *)operator_new(0x20);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::QCallableObject<void_(QTableView::*)(int),_QtPrivate::List<int>,_void>::impl;
    *(code **)(puVar5 + 4) = selectColumn;
    *(undefined8 *)(puVar5 + 6) = 0;
    QObject::connectImpl
              ((QObject *)local_48,ppvVar3,(QObject *)&local_68,(void **)this,&local_58,
               (ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    ppvVar3 = *(void ***)(lVar1 + 0x580);
    local_68 = QHeaderView::sectionEntered;
    local_60 = 0;
    puVar5 = (undefined4 *)operator_new(0x18);
    *puVar5 = 1;
    *(code **)(puVar5 + 2) =
         QtPrivate::
         QCallableObject<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/widgets/itemviews/qtableview.cpp:2752:27),_QtPrivate::List<int>,_void>
         ::impl;
    *(long *)(puVar5 + 4) = lVar1;
    QObject::connectImpl
              ((QObject *)&local_40,ppvVar3,(QObject *)&local_68,(void **)this,
               (QSlotObjectBase *)0x0,(ConnectionType)puVar5,(int *)0x0,(QMetaObject *)0x0);
    std::vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>>::
    _M_assign_aux<QMetaObject::Connection_const*>
              ((vector<QMetaObject::Connection,std::allocator<QMetaObject::Connection>> *)
               (lVar1 + 0x628),local_48,&local_38);
    lVar7 = 8;
    do {
      QMetaObject::Connection::~Connection((Connection *)(local_48 + lVar7));
      lVar7 = lVar7 + -8;
    } while (lVar7 != -8);
  }
  *(bool *)(lVar1 + 0x640) = enable;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableView::setSortingEnabled(bool enable)
{
    Q_D(QTableView);
    horizontalHeader()->setSortIndicatorShown(enable);
    for (const QMetaObject::Connection &connection : d->dynHorHeaderConnections)
        disconnect(connection);
    d->dynHorHeaderConnections.clear();
    if (enable) {
        //sortByColumn has to be called before we connect or set the sortingEnabled flag
        // because otherwise it will not call sort on the model.
        sortByColumn(d->horizontalHeader->sortIndicatorSection(),
                     d->horizontalHeader->sortIndicatorOrder());
        d->dynHorHeaderConnections = {
            QObjectPrivate::connect(d->horizontalHeader, &QHeaderView::sortIndicatorChanged,
                                    d, &QTableViewPrivate::sortIndicatorChanged)
        };
    } else {
        d->dynHorHeaderConnections = {
            connect(d->horizontalHeader, &QHeaderView::sectionPressed,
                    this, &QTableView::selectColumn),
            connect(d->horizontalHeader, &QHeaderView::sectionEntered,
                    this, [d](int column) {d->selectColumn(column, false); })
        };
    }
    d->sortingEnabled = enable;
}